

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

void serial_select_result(int fd,int event)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  size_t sVar5;
  undefined1 local_1018 [3];
  _Bool finished;
  int ret;
  char buf [4096];
  Serial *serial;
  int event_local;
  int fd_local;
  
  bVar1 = false;
  serial._0_4_ = event;
  serial._4_4_ = fd;
  buf._4088_8_ = find234(serial_by_fd,(void *)((long)&serial + 4),serial_find_by_fd);
  if ((Serial *)buf._4088_8_ != (Serial *)0x0) {
    if ((int)serial == 1) {
      sVar3 = read(((Serial *)buf._4088_8_)->fd,local_1018,0x1000);
      iVar2 = (int)sVar3;
      if (iVar2 == 0) {
        bVar1 = true;
      }
      else {
        if (iVar2 < 0) {
          piVar4 = __errno_location();
          if (*piVar4 == 0xb) {
            return;
          }
          piVar4 = __errno_location();
          if (*piVar4 == 0xb) {
            return;
          }
          perror("read serial port");
          exit(1);
        }
        if (0 < iVar2) {
          sVar5 = seat_stdout(*(Seat **)buf._4088_8_,local_1018,(long)iVar2);
          *(size_t *)(buf._4088_8_ + 0x18) = sVar5;
          serial_uxsel_setup((Serial *)buf._4088_8_);
        }
      }
    }
    else if ((int)serial == 2) {
      serial_try_write((Serial *)buf._4088_8_);
    }
    if (bVar1) {
      serial_close((Serial *)buf._4088_8_);
      *(undefined1 *)(buf._4088_8_ + 0x14) = 1;
      seat_notify_remote_exit(*(Seat **)buf._4088_8_);
    }
  }
  return;
}

Assistant:

static void serial_select_result(int fd, int event)
{
    Serial *serial;
    char buf[4096];
    int ret;
    bool finished = false;

    serial = find234(serial_by_fd, &fd, serial_find_by_fd);

    if (!serial)
        return;                /* spurious event; keep going */

    if (event == 1) {
        ret = read(serial->fd, buf, sizeof(buf));

        if (ret == 0) {
            /*
             * Shouldn't happen on a real serial port, but I'm open
             * to the idea that there might be two-way devices we
             * can treat _like_ serial ports which can return EOF.
             */
            finished = true;
        } else if (ret < 0) {
#ifdef EAGAIN
            if (errno == EAGAIN)
                return;        /* spurious */
#endif
#ifdef EWOULDBLOCK
            if (errno == EWOULDBLOCK)
                return;        /* spurious */
#endif
            perror("read serial port");
            exit(1);
        } else if (ret > 0) {
            serial->inbufsize = seat_stdout(serial->seat, buf, ret);
            serial_uxsel_setup(serial); /* might acquire backlog and freeze */
        }
    } else if (event == 2) {
        /*
         * Attempt to send data down the pty.
         */
        serial_try_write(serial);
    }

    if (finished) {
        serial_close(serial);

        serial->finished = true;

        seat_notify_remote_exit(serial->seat);
    }
}